

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::listen_succeeded_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,listen_succeeded_alert *this)

{
  undefined8 uVar1;
  size_t sVar2;
  char ret [200];
  string local_108;
  char local_e8 [208];
  
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::sock_type_str(libtorrent::socket_type_t)::type_str +
           (ulong)this->socket_type * 8);
  print_endpoint_abi_cxx11_
            (&local_108,(libtorrent *)&this->address,(address *)(ulong)(uint)this->port,0x457f60);
  snprintf(local_e8,200,"successfully listening on [%s] %s",uVar1,local_108._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_e8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_e8,local_e8 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string listen_succeeded_alert::message() const
	{
		char ret[200];
		std::snprintf(ret, sizeof(ret), "successfully listening on [%s] %s"
			, sock_type_str(socket_type), print_endpoint(address, port).c_str());
		return ret;
	}